

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

bool __thiscall Options::Parse(Options *this,int argc,char **argv)

{
  pointer *ppoVar1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  int iVar3;
  size_t sVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  char *__s;
  long *local_78 [2];
  long local_68 [2];
  option local_58;
  
  local_58.flag = (int *)0x0;
  local_58.val = 0;
  local_58._28_4_ = 0;
  local_58.name = (char *)0x0;
  local_58.has_arg = 0;
  local_58._12_4_ = 0;
  __position._M_current =
       (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<option,_std::allocator<option>_>::_M_realloc_insert<option>
              (&this->options,__position,&local_58);
  }
  else {
    (__position._M_current)->flag = (int *)0x0;
    *(undefined8 *)&(__position._M_current)->val = 0;
    (__position._M_current)->name = (char *)0x0;
    *(undefined8 *)&(__position._M_current)->has_arg = 0;
    ppoVar1 = &(this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppoVar1 = *ppoVar1 + 1;
  }
  iVar3 = getopt_long(argc,argv,(this->optstr)._M_dataplus._M_p,
                      (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                      super__Vector_impl_data._M_start,0);
  local_58.name = (char *)CONCAT44(local_58.name._4_4_,iVar3);
  if (iVar3 != -1) {
    p_Var2 = &(this->setters)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var6 = (this->setters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var2->_M_header;
      if (p_Var6 == (_Base_ptr)0x0) {
        return false;
      }
      do {
        if (iVar3 <= (int)*(size_t *)(p_Var6 + 1)) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < iVar3];
      } while (p_Var6 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var7 == p_Var2) {
        return false;
      }
      if (iVar3 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count) {
        return false;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->was_set,(int *)&local_58);
      __s = _optarg;
      if (_optarg == (char *)0x0) {
        __s = "";
      }
      local_78[0] = local_68;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,__s,__s + sVar4);
      if (*(long *)((undefined1 *)((long)p_Var7 + 0x28) + 0x10) == 0) {
        uVar5 = std::__throw_bad_function_call();
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        _Unwind_Resume(uVar5);
      }
      (**(code **)((undefined1 *)((long)p_Var7 + 0x28) + 0x18))
                ((undefined1 *)((long)p_Var7 + 0x28),(string *)local_78);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      iVar3 = getopt_long(argc,argv,(this->optstr)._M_dataplus._M_p,
                          (this->options).super__Vector_base<option,_std::allocator<option>_>.
                          _M_impl.super__Vector_impl_data._M_start,0);
      local_58.name = (char *)CONCAT44(local_58.name._4_4_,iVar3);
    } while (iVar3 != -1);
  }
  return true;
}

Assistant:

inline bool Options::Parse(int argc, char** argv) {
    this->options.push_back({0, 0, 0, 0});
    int ch;
    while ((ch = getopt_long(argc, argv, this->optstr.c_str(), &this->options[0], NULL)) != -1) {
        auto it = this->setters.find(ch);
        if (it != this->setters.end()) {
            this->was_set.insert(ch);
            it->second(optarg ? optarg : "");
        } else {
            return false;
        }
    }
    return true;
}